

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
mpt::reference<mpt::layout>::reference(reference<mpt::layout> *this,reference<mpt::layout> *ref)

{
  this->_ref = (layout *)0x0;
  operator=(this,ref);
  return;
}

Assistant:

inline reference(const reference &ref) : _ref(0)
	{
		*this = ref;
	}